

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O1

void TT_Get_VMetrics(TT_Face face,FT_UInt idx,FT_Pos yMax,FT_Short *tsb,FT_UShort *ah)

{
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  code *UNRECOVERED_JUMPTABLE;
  FT_UShort FVar4;
  FT_UShort FVar5;
  
  if (face->vertical_info != '\0') {
    UNRECOVERED_JUMPTABLE = *(code **)((long)face->sfnt + 0xe0);
    (*UNRECOVERED_JUMPTABLE)(face,1,idx,tsb,ah,UNRECOVERED_JUMPTABLE);
    return;
  }
  if ((face->os2).version == 0xffff) {
    uVar3 = (face->horizontal).Ascender;
    *tsb = uVar3 - (short)yMax;
    sVar1 = (face->horizontal).Ascender;
    sVar2 = (face->horizontal).Descender;
  }
  else {
    *tsb = (face->os2).sTypoAscender - (short)yMax;
    sVar1 = (face->os2).sTypoAscender;
    sVar2 = (face->os2).sTypoDescender;
  }
  FVar4 = (FT_UShort)((int)sVar1 - (int)sVar2);
  FVar5 = -FVar4;
  if (0 < (int)sVar1 - (int)sVar2) {
    FVar5 = FVar4;
  }
  *ah = FVar5;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  TT_Get_VMetrics( TT_Face     face,
                   FT_UInt     idx,
                   FT_Pos      yMax,
                   FT_Short*   tsb,
                   FT_UShort*  ah )
  {
    if ( face->vertical_info )
      ( (SFNT_Service)face->sfnt )->get_metrics( face, 1, idx, tsb, ah );

    else if ( face->os2.version != 0xFFFFU )
    {
      *tsb = (FT_Short)( face->os2.sTypoAscender - yMax );
      *ah  = (FT_UShort)FT_ABS( face->os2.sTypoAscender -
                                face->os2.sTypoDescender );
    }

    else
    {
      *tsb = (FT_Short)( face->horizontal.Ascender - yMax );
      *ah  = (FT_UShort)FT_ABS( face->horizontal.Ascender -
                                face->horizontal.Descender );
    }

    FT_TRACE5(( "  advance height (font units): %d\n", *ah ));
    FT_TRACE5(( "  top side bearing (font units): %d\n", *tsb ));
  }